

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physics.cpp
# Opt level: O1

int main(void)

{
  ulong uVar1;
  _Tuple_impl<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
  _Var2;
  undefined8 uVar3;
  int iVar4;
  pointer pNVar5;
  result_type rVar6;
  ostream *poVar7;
  long lVar8;
  ulong uVar9;
  pointer *queryBox;
  ulong uVar10;
  vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *intersections;
  Node *__ptr;
  vector<Node_*,_std::allocator<Node_*>_> *in_R8;
  Node *node;
  pointer pNVar11;
  undefined1 auVar12 [8];
  Node *node_1;
  int iVar13;
  Node *node_2;
  pointer pNVar14;
  bool bVar15;
  param_type local_118;
  uniform_int_distribution<int> deathDistribution;
  default_random_engine generator;
  undefined1 local_f0 [8];
  vector<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
  intersections1;
  vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> intersections3;
  undefined1 local_b8 [32];
  undefined1 local_98 [8];
  vector<bool,_std::allocator<bool>_> removed;
  vector<Node,_std::allocator<Node>_> nodes;
  vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> intersections2;
  char local_31;
  
  generateRandomNodes((vector<Node,_std::allocator<Node>_> *)
                      &removed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage,1000);
  local_b8._0_8_ =
       (__uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
        )0x0;
  local_b8._8_8_ =
       (__uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
        )0x3f8000003f800000;
  local_b8._16_8_ = operator_new(0x38);
  (((Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
     *)(local_b8._16_8_ + 0x20))->mBox).left = 0.0;
  (((Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
     *)(local_b8._16_8_ + 0x20))->mBox).top = 0.0;
  *(undefined8 *)(local_b8._16_8_ + 0x28) = 0;
  (((unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
     *)(local_b8._16_8_ + 0x10))->_M_t).
  super___uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
  ._M_t.
  super__Tuple_impl<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
  .
  super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
  ._M_head_impl = (Node *)0x0;
  *(undefined8 *)(local_b8._16_8_ + 0x18) = 0;
  *(undefined8 *)local_b8._16_8_ = 0;
  *(undefined8 *)(local_b8._16_8_ + 8) = 0;
  (((unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
     *)(local_b8._16_8_ + 0x30))->_M_t).
  super___uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
  ._M_t.
  super__Tuple_impl<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
  .
  super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
  ._M_head_impl = (Node *)0x0;
  lVar8 = 0;
  do {
    *(undefined8 *)(local_b8._16_8_ + lVar8) = 0;
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0x20);
  (((Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
     *)(local_b8._16_8_ + 0x20))->mBox).left = 0.0;
  (((Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
     *)(local_b8._16_8_ + 0x20))->mBox).top = 0.0;
  *(undefined8 *)(local_b8._16_8_ + 0x28) = 0;
  (((unique_ptr<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
     *)(local_b8._16_8_ + 0x30))->_M_t).
  super___uniq_ptr_impl<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
  ._M_t.
  super__Tuple_impl<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_std::default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>_>
  .
  super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
  ._M_head_impl = (Node *)0x0;
  std::chrono::_V2::steady_clock::now();
  pNVar14 = nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
            _M_start;
  uVar3 = local_b8._16_8_;
  if ((pointer)removed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_end_of_storage !=
      nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data._M_start
     ) {
    pNVar11 = (pointer)removed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_end_of_storage;
    do {
      local_98 = (undefined1  [8])pNVar11;
      quadtree::
      Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
      ::add((Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
             *)uVar3,(Node *)0x0,(size_t)local_b8,(Box<float> *)local_98,(Node **)in_R8);
      pNVar11 = pNVar11 + 1;
    } while (pNVar11 != pNVar14);
  }
  deathDistribution._M_param._M_a = 1;
  deathDistribution._M_param._M_b = 0;
  local_118._M_a = 0;
  local_118._M_b = 1;
  local_f0 = (undefined1  [8])((ulong)local_f0 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_98,
             ((long)nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_start -
              (long)removed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage >> 3) * -0x5555555555555555,
             (bool *)local_f0,
             (allocator_type *)
             &nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  iVar4 = (int)removed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_finish.super__Bit_iterator_base._M_p;
  uVar3 = removed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._8_8_;
  _Var2.
  super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
  ._M_head_impl =
       (_Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
        )(_Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
          )local_b8._16_8_;
  pNVar14 = (pointer)removed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage;
  pNVar11 = nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
            _M_start;
  if ((int)removed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p != 0 ||
      local_98 !=
      (undefined1  [8])
      removed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._8_8_) {
    iVar13 = 0;
    auVar12 = local_98;
    do {
      rVar6 = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)&local_118,
                         (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
                         &deathDistribution,&local_118);
      uVar10 = 1L << ((byte)iVar13 & 0x3f);
      if (rVar6 == 0) {
        uVar9._0_4_ = (((pointer)auVar12)->box).left;
        uVar9._4_4_ = (((pointer)auVar12)->box).top;
        uVar10 = ~uVar10 & uVar9;
      }
      else {
        uVar1._0_4_ = (((pointer)auVar12)->box).left;
        uVar1._4_4_ = (((pointer)auVar12)->box).top;
        uVar10 = uVar10 | uVar1;
      }
      (((pointer)auVar12)->box).left = (float)(int)uVar10;
      (((pointer)auVar12)->box).top = (float)(int)(uVar10 >> 0x20);
      bVar15 = iVar13 == 0x3f;
      iVar13 = iVar13 + 1;
      auVar12 = (undefined1  [8])(&(((pointer)auVar12)->box).left + (ulong)bVar15 * 2);
      if (bVar15) {
        iVar13 = 0;
      }
      _Var2.
      super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
      ._M_head_impl =
           (_Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
            )(_Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
              )local_b8._16_8_;
      pNVar14 = (pointer)removed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_end_of_storage;
      pNVar11 = nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (iVar13 != iVar4 || auVar12 != (undefined1  [8])uVar3);
  }
  for (; pNVar5 = nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                  super__Vector_impl_data._M_start, uVar3 = local_b8._16_8_,
      local_b8._16_8_ =
           _Var2.
           super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
           ._M_head_impl,
      pNVar14 !=
      nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data._M_start
      ; pNVar14 = pNVar14 + 1) {
    uVar10 = pNVar14->id;
    uVar9 = uVar10 + 0x3f;
    if (-1 < (long)uVar10) {
      uVar9 = uVar10;
    }
    nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data._M_start =
         pNVar11;
    if ((*(ulong *)((long)local_98 +
                   (ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                   ((long)uVar9 >> 6) * 8 + -8) >> (uVar10 & 0x3f) & 1) != 0) {
      local_f0 = (undefined1  [8])pNVar14;
      quadtree::
      Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
      ::remove((Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
                *)uVar3,local_b8);
    }
    _Var2.
    super__Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
    ._M_head_impl =
         (_Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
          )(_Head_base<0UL,_quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node_*,_false>
            )local_b8._16_8_;
    pNVar11 = nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
              _M_start;
    nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data._M_start =
         pNVar5;
    local_b8._16_8_ = uVar3;
  }
  nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data._M_start =
       pNVar11;
  std::
  vector<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
  ::vector((vector<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
            *)local_f0,
           ((long)pNVar11 -
            (long)removed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage >> 3) * -0x5555555555555555,
           (allocator_type *)
           &nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage);
  std::chrono::_V2::steady_clock::now();
  uVar3 = local_b8._16_8_;
  for (pNVar14 = (pointer)removed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage;
      pNVar14 !=
      nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data._M_start
      ; pNVar14 = pNVar14 + 1) {
    queryBox = &nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    uVar10 = pNVar14->id;
    uVar9 = uVar10 + 0x3f;
    if (-1 < (long)uVar10) {
      uVar9 = uVar10;
    }
    if ((*(ulong *)((long)local_98 +
                   (ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) * 8 +
                   ((long)uVar9 >> 6) * 8 + -8) >> (uVar10 & 0x3f) & 1) == 0) {
      nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      intersections2.
      super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      quadtree::
      Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
      ::query((Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
               *)uVar3,(Node *)local_b8,&pNVar14->box,(Box<float> *)queryBox,in_R8);
      std::vector<Node_*,_std::allocator<Node_*>_>::_M_move_assign
                ((vector<Node_*,_std::allocator<Node_*>_> *)((long)local_f0 + pNVar14->id * 0x18),
                 queryBox);
      if (nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage != (pointer)0x0) {
        operator_delete(nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                        -(long)nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
      }
    }
  }
  std::chrono::_V2::steady_clock::now();
  std::chrono::_V2::steady_clock::now();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"quadtree: ",10);
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"us",2);
  nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)CONCAT71(nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,(char *)&nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"quadtree with creation: ",0x18);
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"us",2);
  nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)CONCAT71(nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,(char *)&nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,1);
  computeIntersections
            ((vector<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_> *)
             &nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,
             (vector<Node,_std::allocator<Node>_> *)
             &removed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage,(vector<bool,_std::allocator<bool>_> *)local_98);
  intersections1.
  super__Vector_base<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  quadtree::
  Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
  ::findAllIntersections
            ((Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
              *)local_b8._16_8_,
             (Node *)&intersections1.
                      super__Vector_base<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,intersections);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  local_31 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,&stack0xffffffffffffffcf,1);
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  __ptr = (Node *)&stack0xffffffffffffffcf;
  local_31 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)__ptr,1);
  if (intersections1.
      super__Vector_base<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    __ptr = (Node *)-(long)intersections1.
                           super__Vector_base<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
    operator_delete(intersections1.
                    super__Vector_base<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)__ptr);
  }
  if (nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    __ptr = (Node *)((long)intersections2.
                           super__Vector_base<std::pair<Node_*,_Node_*>,_std::allocator<std::pair<Node_*,_Node_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    operator_delete(nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(ulong)__ptr);
  }
  std::
  vector<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
  ::~vector((vector<std::vector<Node_*,_std::allocator<Node_*>_>,_std::allocator<std::vector<Node_*,_std::allocator<Node_*>_>_>_>
             *)local_f0);
  if (local_98 != (undefined1  [8])0x0) {
    __ptr = (Node *)(removed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ -
                    (long)local_98);
    operator_delete((void *)local_98,(ulong)__ptr);
    local_98 = (undefined1  [8])0x0;
    removed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p._0_4_ = 0;
    removed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    removed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._12_4_ = 0;
    removed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p._0_4_ = 0;
    removed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    removed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._12_4_ = 0;
  }
  if ((Node *)local_b8._16_8_ != (Node *)0x0) {
    std::
    default_delete<quadtree::Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>::Node>
    ::operator()((default_delete<quadtree::Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>::Node>
                  *)local_b8._16_8_,__ptr);
  }
  if (removed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage != (_Bit_pointer)0x0) {
    operator_delete(removed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage,
                    (long)nodes.super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)removed.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage);
  }
  return 0;
}

Assistant:

int main()
{
    auto n = std::size_t(1000);
    auto getBox = [](Node* node)
    {
        return node->box;
    };
    auto box = Box(0.0f, 0.0f, 1.0f, 1.0f);
    auto nodes = generateRandomNodes(n);
    // Add nodes to quadtree
    auto quadtree = Quadtree<Node*, decltype(getBox)>(box, getBox);
    auto start1 = std::chrono::steady_clock::now();
    for (auto& node : nodes)
        quadtree.add(&node);
    // Randomly remove some nodes
    auto generator = std::default_random_engine();
    auto deathDistribution = std::uniform_int_distribution(0, 1);
    auto removed = std::vector<bool>(nodes.size(), false);
    std::generate(std::begin(removed), std::end(removed),
        [&generator, &deathDistribution](){ return deathDistribution(generator); });
    for (auto& node : nodes)
    {
        if (removed[node.id])
            quadtree.remove(&node);
    }
    // Quadtree
    auto intersections1 = std::vector<std::vector<Node*>>(nodes.size());
    auto start2 = std::chrono::steady_clock::now();
    for (const auto& node : nodes)
    {
        if (!removed[node.id])
            intersections1[node.id] = quadtree.query(node.box);
    }
    auto duration2 = std::chrono::steady_clock::now() - start2;
    auto duration1 = std::chrono::steady_clock::now() - start1;
    std::cout << "quadtree: " << std::chrono::duration_cast<std::chrono::microseconds>(duration2).count() << "us" << '\n';
    std::cout << "quadtree with creation: " << std::chrono::duration_cast<std::chrono::microseconds>(duration1).count() << "us" << '\n';
    // Brute force
    auto intersections2 = computeIntersections(nodes, removed);
    // Check
    //checkIntersections(intersections1[node.id], intersections2[node.id]);
    // Find all intersections
    auto intersections3 = quadtree.findAllIntersections();
    std::cout << intersections3.size() << '\n';
    std::cout << intersections2.size() << '\n';

    return 0;
}